

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O1

vector<CWire_*,_std::allocator<CWire_*>_> * __thiscall
CWire::AdjustByBoundary
          (vector<CWire_*,_std::allocator<CWire_*>_> *__return_storage_ptr__,CWire *this)

{
  pointer *pppCVar1;
  uint *puVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  CPoint *pCVar6;
  iterator iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  CLayer *this_00;
  void *pvVar11;
  CLayer *pCVar12;
  CBoundary *pCVar13;
  CWire *pCVar14;
  CWire *this_01;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  vector<CWire_*,_std::allocator<CWire_*>_> *AdjWire;
  CWire *pWire;
  CWire *local_68;
  void *local_60;
  CWire *local_58;
  uint local_50;
  uint local_4c;
  CNet *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar16 = (this->super_CObject).m_iState;
  if ((uVar16 & 1) == 0) {
    __assert_fail("IsRouted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x16e,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  if ((uVar16 & 4) == 0) {
    __assert_fail("IsLayerAssigned()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x16f,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = 0;
  if (((this->super_CObject).m_iProp & 0x200) == 0) {
    iVar8 = CPoint::GetMDistance(this->m_pPointS,this->m_pPointE);
  }
  std::vector<CWire_*,_std::allocator<CWire_*>_>::reserve(__return_storage_ptr__,(long)iVar8);
  this_00 = GetLayer(this);
  if (this_00 == (CLayer *)0x0) {
    __assert_fail("pLayer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x175,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  local_48 = (CNet *)(this->super_CObject).m_pParent;
  if (local_48 == (CNet *)0x0) {
    __assert_fail("pNet",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x177,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  uVar16 = (this->super_CObject).m_iProp;
  local_58 = this;
  if ((uVar16 & 5) == 0) {
    if ((uVar16 & 10) == 0) {
      if ((uVar16 >> 9 & 1) == 0) {
        __assert_fail("IsPoint()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x21c,"vector<CWire *> CWire::AdjustByBoundary()");
      }
      iVar7._M_current =
           (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current !=
          (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *iVar7._M_current = this;
        pppCVar1 = &(__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
        return __return_storage_ptr__;
      }
      local_68 = this;
      std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*>
                ((vector<CWire*,std::allocator<CWire*>> *)__return_storage_ptr__,iVar7,&local_68);
      return __return_storage_ptr__;
    }
    iVar15 = (int)this->m_pPointE->m_iY;
    iVar8 = (int)this->m_pPointS->m_iY;
    local_50 = iVar15 - iVar8;
    if (local_50 == 0 || iVar15 < iVar8) {
      __assert_fail("iNumBoundary>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x1cd,"vector<CWire *> CWire::AdjustByBoundary()");
    }
    uVar17 = (ulong)local_50;
    pvVar11 = operator_new__(uVar17 * 4 + 4);
    local_40 = uVar17 + 1;
    uVar18 = 0;
    memset(pvVar11,0,uVar17 * 4);
    *(undefined4 *)((long)pvVar11 + uVar17 * 4) = 1;
    uVar16 = 0;
    local_60 = pvVar11;
    local_38 = uVar17;
    do {
      local_4c = uVar16;
      if ((CObject::m_pDesign->super_CBBox).m_cMinZ < (CObject::m_pDesign->super_CBBox).m_cMaxZ) {
        iVar8 = 0;
        do {
          iVar8 = iVar8 + 1;
          pCVar12 = CDesign::GetLayer(CObject::m_pDesign,iVar8);
          iVar15 = CLayer::GetDirection(pCVar12);
          iVar9 = CLayer::GetDirection(this_00);
          if (iVar15 == iVar9) {
            pCVar13 = CLayer::GetBoundary(pCVar12,(int)local_58->m_pPointS->m_iX,
                                          (int)local_58->m_pPointS->m_iY + (int)uVar18);
            uVar16 = CBoundary::IsFound(pCVar13,local_48);
            puVar2 = (uint *)((long)local_60 + uVar18 * 4);
            *puVar2 = *puVar2 | uVar16;
          }
        } while (iVar8 < (int)(CObject::m_pDesign->super_CBBox).m_cMaxZ -
                         (int)(CObject::m_pDesign->super_CBBox).m_cMinZ);
      }
      pCVar14 = local_58;
      pvVar11 = local_60;
      uVar16 = local_4c + *(int *)((long)local_60 + uVar18 * 4);
      uVar18 = uVar18 + 1;
    } while (uVar18 != local_38);
    if (uVar16 == 0) {
      local_68 = local_58;
      iVar7._M_current =
           (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*>
                  ((vector<CWire*,std::allocator<CWire*>> *)__return_storage_ptr__,iVar7,&local_68);
      }
      else {
        *iVar7._M_current = local_58;
        pppCVar1 = &(__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
    }
    else if (uVar16 == local_50) {
      if ((__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        __assert_fail("AdjWire.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x1ec,"vector<CWire *> CWire::AdjustByBoundary()");
      }
      (local_58->super_CObject).m_pParent = (CObject *)0x0;
      Delete(local_58);
    }
    else {
      pCVar6 = local_58->m_pPointS;
      local_48 = (CNet *)(ulong)(uint)(int)pCVar6->m_iY;
      sVar4 = pCVar6->m_iX;
      cVar3 = pCVar6->m_cZ;
      uVar18 = 0xffffffff;
      uVar17 = 0;
      do {
        iVar8 = (int)uVar18;
        if (*(int *)((long)local_60 + uVar17 * 4) == 0) {
          if (iVar8 < 0) {
            uVar18 = uVar17 & 0xffffffff;
          }
        }
        else if (-1 < iVar8) {
          if (uVar17 <= uVar18) {
            __assert_fail("iNSY<iNEY",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                          ,0x204,"vector<CWire *> CWire::AdjustByBoundary()");
          }
          this_01 = (CWire *)operator_new(0x50);
          CObject::CObject((CObject *)this_01);
          (this_01->super_CObject)._vptr_CObject = (_func_int **)&PTR__CWire_00189d48;
          this_01->m_pRoutedSegmentList = (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0;
          (this_01->m_SegmentList).
          super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (this_01->m_SegmentList).
          super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (this_01->m_SegmentList).
          super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this_01->m_pPointE = (CPoint *)0x0;
          this_01->m_pPointS = (CPoint *)0x0;
          local_68 = this_01;
          Initialize(this_01,(int)sVar4,iVar8 + (int)local_48,(int)cVar3,(int)sVar4,
                     (int)uVar17 + (int)local_48,(int)cVar3);
          (this_01->super_CObject).m_pParent = (pCVar14->super_CObject).m_pParent;
          (this_01->super_CObject).m_iState = (pCVar14->super_CObject).m_iState;
          iVar7._M_current =
               (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*const&>
                      ((vector<CWire*,std::allocator<CWire*>> *)__return_storage_ptr__,iVar7,
                       &local_68);
          }
          else {
            *iVar7._M_current = local_68;
            pppCVar1 = &(__return_storage_ptr__->
                        super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppCVar1 = *pppCVar1 + 1;
          }
          uVar18 = 0xffffffff;
        }
        uVar17 = uVar17 + 1;
      } while (local_40 != uVar17);
      (pCVar14->super_CObject).m_pParent = (CObject *)0x0;
      Delete(pCVar14);
      pvVar11 = local_60;
    }
  }
  else {
    iVar15 = (int)this->m_pPointE->m_iX;
    iVar8 = (int)this->m_pPointS->m_iX;
    uVar16 = iVar15 - iVar8;
    if ((uVar16 == 0 || iVar15 < iVar8) ||
       (((int)(CObject::m_pDesign->super_CBBox).m_iMaxX -
         (int)(CObject::m_pDesign->super_CBBox).m_iMinX < (int)uVar16 &&
        ((int)(CObject::m_pDesign->super_CBBox).m_iMaxY -
         (int)(CObject::m_pDesign->super_CBBox).m_iMinY < (int)uVar16)))) {
      __assert_fail("iNumBoundary>0&&(iNumBoundary<=GetDesign()->W()||iNumBoundary<=GetDesign()->H())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x17d,"vector<CWire *> CWire::AdjustByBoundary()");
    }
    uVar18 = (ulong)uVar16;
    pvVar11 = operator_new__(uVar18 * 4 + 4);
    local_40 = uVar18 + 1;
    uVar17 = 0;
    memset(pvVar11,0,uVar18 * 4);
    *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
    local_38 = 1;
    if (1 < (int)uVar16) {
      local_38 = (ulong)uVar16;
    }
    uVar10 = 0;
    local_60 = pvVar11;
    local_50 = uVar16;
    do {
      local_4c = uVar10;
      if ((CObject::m_pDesign->super_CBBox).m_cMinZ < (CObject::m_pDesign->super_CBBox).m_cMaxZ) {
        iVar8 = 0;
        do {
          iVar8 = iVar8 + 1;
          pCVar12 = CDesign::GetLayer(CObject::m_pDesign,iVar8);
          iVar15 = CLayer::GetDirection(pCVar12);
          iVar9 = CLayer::GetDirection(this_00);
          if (iVar15 == iVar9) {
            pCVar13 = CLayer::GetBoundary(pCVar12,(int)local_58->m_pPointS->m_iX + (int)uVar17,
                                          (int)local_58->m_pPointS->m_iY);
            uVar16 = CBoundary::IsFound(pCVar13,local_48);
            puVar2 = (uint *)((long)local_60 + uVar17 * 4);
            *puVar2 = *puVar2 | uVar16;
          }
        } while (iVar8 < (int)(CObject::m_pDesign->super_CBBox).m_cMaxZ -
                         (int)(CObject::m_pDesign->super_CBBox).m_cMinZ);
      }
      pvVar11 = local_60;
      uVar10 = local_4c + *(int *)((long)local_60 + uVar17 * 4);
      uVar17 = uVar17 + 1;
    } while (uVar17 != local_38);
    if (uVar10 == 0) {
      local_68 = local_58;
      iVar7._M_current =
           (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*>
                  ((vector<CWire*,std::allocator<CWire*>> *)__return_storage_ptr__,iVar7,&local_68);
      }
      else {
        *iVar7._M_current = local_58;
        pppCVar1 = &(__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
    }
    else if (uVar10 == local_50) {
      if ((__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        __assert_fail("AdjWire.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x19e,"vector<CWire *> CWire::AdjustByBoundary()");
      }
      (local_58->super_CObject).m_pParent = (CObject *)0x0;
      Delete(local_58);
    }
    else {
      pCVar6 = local_58->m_pPointS;
      sVar4 = pCVar6->m_iX;
      sVar5 = pCVar6->m_iY;
      cVar3 = pCVar6->m_cZ;
      uVar18 = 0xffffffff;
      uVar17 = 0;
      do {
        iVar8 = (int)uVar18;
        if (*(int *)((long)local_60 + uVar17 * 4) == 0) {
          if (iVar8 < 0) {
            uVar18 = uVar17 & 0xffffffff;
          }
        }
        else if (-1 < iVar8) {
          pCVar14 = (CWire *)operator_new(0x50);
          CObject::CObject((CObject *)pCVar14);
          (pCVar14->super_CObject)._vptr_CObject = (_func_int **)&PTR__CWire_00189d48;
          pCVar14->m_pRoutedSegmentList = (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0;
          (pCVar14->m_SegmentList).
          super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pCVar14->m_SegmentList).
          super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pCVar14->m_SegmentList).
          super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pCVar14->m_pPointE = (CPoint *)0x0;
          pCVar14->m_pPointS = (CPoint *)0x0;
          local_68 = pCVar14;
          Initialize(pCVar14,iVar8 + sVar4,(int)sVar5,(int)cVar3,(int)uVar17 + (int)sVar4,(int)sVar5
                     ,(int)cVar3);
          (pCVar14->super_CObject).m_pParent = (local_58->super_CObject).m_pParent;
          (pCVar14->super_CObject).m_iState = (local_58->super_CObject).m_iState;
          iVar7._M_current =
               (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*const&>
                      ((vector<CWire*,std::allocator<CWire*>> *)__return_storage_ptr__,iVar7,
                       &local_68);
          }
          else {
            *iVar7._M_current = local_68;
            pppCVar1 = &(__return_storage_ptr__->
                        super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppCVar1 = *pppCVar1 + 1;
          }
          uVar18 = 0xffffffff;
        }
        uVar17 = uVar17 + 1;
      } while (local_40 != uVar17);
      (local_58->super_CObject).m_pParent = (CObject *)0x0;
      Delete(local_58);
      pvVar11 = local_60;
    }
  }
  operator_delete__(pvVar11);
  return __return_storage_ptr__;
}

Assistant:

vector<CWire*> CWire::AdjustByBoundary()
{
	assert(IsRouted());
	assert(IsLayerAssigned());

	vector<CWire*>		AdjWire;
	AdjWire.reserve(GetLength());

	CLayer*	pLayer		=	GetLayer();
	assert(pLayer);
	CNet*	pNet		=	GetParent();
	assert(pNet);

	int	iNumBoundary	=	0;
	if(IsHorizontal())
	{
		iNumBoundary			=	m_pPointE->X()-m_pPointS->X();
		assert(iNumBoundary>0&&(iNumBoundary<=GetDesign()->W()||iNumBoundary<=GetDesign()->H()));

		int*	pBoundary		=	new	int[iNumBoundary+1];
		assert(pBoundary);

		memset(pBoundary,0x00,iNumBoundary*sizeof(int));
		pBoundary[iNumBoundary]	=	1;	// mark as the last element [7/5/2006 thyeros]

		int	iSum	=	0;
		int	i,j;
		for (i=0;i<iNumBoundary;++i)
		{
			for (j=1;j<=GetDesign()->T();++j)
			{
				CLayer*	pCurLayer	=	GetDesign()->GetLayer(j);

				if(pCurLayer->GetDirection()==pLayer->GetDirection())
				{
					pBoundary[i]	|=	pCurLayer->GetBoundary(i+m_pPointS->X(),m_pPointS->Y())->IsFound(pNet);	
				}
			}

			iSum	+=	pBoundary[i];
		}

		if(iSum==0)
		{	
			// whole wire is needed [7/5/2006 thyeros]
			AdjWire.push_back(this);
		}
		else if(iSum==iNumBoundary)
		{
			// already wires are there, discard this wire [7/5/2006 thyeros]
			assert(AdjWire.empty());

			m_pParent	=	NULL;
			Delete();//delete	this;
		}
		else
		{
			// partially needed [7/5/2006 thyeros]
			int	iSX		=	m_pPointS->X();
			int	iEX		=	m_pPointE->X();
			int	iY		=	m_pPointS->Y();
			int	iZ		=	m_pPointS->Z();

			int	iLast	=	-1;
			for (i=0;i<iNumBoundary+1;++i)
			{
				if(pBoundary[i])
				{
					if(iLast>=0)
					{
						// create wire between iLast and i [7/5/2006 thyeros]
						int	iNSX	=	iSX+iLast;
						int	iNEX	=	iSX+i;
						
						CWire*	pWire	=	new CWire;
						pWire->Initialize(iNSX,iY,iNEX,iY,iZ,this);
						
						AdjWire.push_back(pWire);
						
						iLast	=	-1;
					}
				}
				else
				{
					if(iLast<0)		iLast	=	i;
				}
			}

			m_pParent	=	NULL;
			Delete();//delete	this;
		}

		SAFE_DELA(pBoundary);
	}
	else if(IsVertical())
	{
		iNumBoundary	=	m_pPointE->Y()-m_pPointS->Y();
		assert(iNumBoundary>0);

		int*	pBoundary		=	new	int[iNumBoundary+1];
		memset(pBoundary,0x00,iNumBoundary*sizeof(int));
		pBoundary[iNumBoundary]	=	1;	// mark as the last element [7/5/2006 thyeros]
		assert(pBoundary);

		int	iSum	=	0;
		int	i,j;
		for (i=0;i<iNumBoundary;++i)
		{
			for (j=1;j<=GetDesign()->T();++j)
			{
				CLayer*	pCurLayer	=	GetDesign()->GetLayer(j);

				if(pCurLayer->GetDirection()==pLayer->GetDirection())
				{
					pBoundary[i]	|=	pCurLayer->GetBoundary(m_pPointS->X(),i+m_pPointS->Y())->IsFound(pNet);	
				}
			}
			iSum	+=	pBoundary[i];
		}

		if(iSum==0)
		{	
			// whole wire is needed [7/5/2006 thyeros]
			AdjWire.push_back(this);
		}
		else if(iSum==iNumBoundary)
		{
			// already wires are there, discard this wire [7/5/2006 thyeros]
			assert(AdjWire.empty());

			m_pParent	=	NULL;
			Delete();//delete	this;
		}
		else
		{
			// partially needed [7/5/2006 thyeros]
			int	iSY		=	m_pPointS->Y();
			int	iEY		=	m_pPointE->Y();
			int	iX		=	m_pPointS->X();
			int	iZ		=	m_pPointS->Z();

			int	iLast	=	-1;
			for (i=0;i<iNumBoundary+1;++i)
			{
				if(pBoundary[i])
				{
					if(iLast>=0)
					{
						// create wire between iLast and i [7/5/2006 thyeros]
						int	iNSY	=	iSY+iLast;
						int	iNEY	=	iSY+i;
						
						assert(iNSY<iNEY);
						
						CWire*	pWire	=	new CWire;
						pWire->Initialize(iX,iNSY,iX,iNEY,iZ,this);
						
						AdjWire.push_back(pWire);
						
						iLast	=	-1;	
					}				
				}
				else
				{
					if(iLast<0)		iLast	=	i;
				}
			}

			m_pParent	=	NULL;
			Delete();//delete	this;
		}

		SAFE_DELA(pBoundary);
	}
	else
	{
		assert(IsPoint());
		AdjWire.push_back(this);
	}

	return	AdjWire;
}